

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

char * strdup_rpl(char *str)

{
  size_t __n;
  char *s;
  size_t l;
  char *str_local;
  
  __n = strlen(str);
  str_local = (char *)calloc(__n + 1,1);
  if (str_local == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    memcpy(str_local,str,__n);
  }
  return str_local;
}

Assistant:

static char* strdup_rpl(const char *str)
{
    size_t l = strlen(str);
    char *s = (char*)calloc(l + 1, sizeof(char));
    if(!s) {
        return NULL;
    }
    (void)memcpy(s, str, l);
    return s;
}